

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O3

el_action_t ce_inc_search(EditLine *el,wchar_t dir)

{
  wchar_t **ppwVar1;
  byte bVar2;
  byte bVar3;
  el_action_t eVar4;
  wchar_t wVar5;
  size_t sVar6;
  void *pvVar7;
  wchar_t *pwVar8;
  byte bVar9;
  el_line_t *peVar10;
  uint uVar11;
  wchar_t *pwVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  el_action_t eVar15;
  bool bVar16;
  bool bVar17;
  wchar_t ch;
  wchar_t local_68;
  wchar_t local_64;
  wchar_t *local_60;
  wchar_t local_58;
  wchar_t local_54;
  el_line_t *local_50;
  size_t local_48;
  long local_40;
  long local_38;
  
  bVar3 = ce_inc_search_pchar;
  local_48 = (el->el_search).patlen;
  if ((el->el_line).lastchar + local_48 + 6 < (el->el_line).limit) {
    local_50 = &el->el_line;
    local_60 = (el->el_line).cursor;
    local_64 = (el->el_history).eventno;
    ppwVar1 = &(el->el_line).lastchar;
    bVar16 = dir == L'\x18';
    local_58 = L'\x7fffffff';
    if (bVar16) {
      local_58 = L'\0';
    }
    local_38 = (ulong)bVar16 * 0x10 + 0x50;
    local_40 = (-(ulong)bVar16 | 1) << 2;
    local_54 = dir;
    while( true ) {
      sVar6 = (el->el_search).patlen;
      if (sVar6 == 0) {
        ce_inc_search_pchar = 0;
        pwVar13 = (el->el_search).patbuf;
        *pwVar13 = L'.';
        (el->el_search).patlen = 2;
        pwVar13[1] = L'*';
        sVar6 = 2;
      }
      pwVar13 = *ppwVar1;
      *pwVar13 = L'\n';
      pwVar12 = L"fwd";
      if (dir == L'\x18') {
        pwVar12 = L"bck";
      }
      wVar5 = *pwVar12;
      while (pwVar13 = pwVar13 + 1, wVar5 != L'\0') {
        pwVar12 = pwVar12 + 1;
        *pwVar13 = wVar5;
        wVar5 = *pwVar12;
      }
      uVar11 = (uint)ce_inc_search_pchar;
      pwVar12 = pwVar13 + 1;
      (el->el_line).lastchar = pwVar12;
      *pwVar13 = uVar11 * 5 + L':';
      if (2 < (long)sVar6) {
        pwVar13 = (el->el_search).patbuf;
        pwVar8 = pwVar13 + 2;
        do {
          wVar5 = *pwVar8;
          pwVar8 = pwVar8 + 1;
          *pwVar12 = wVar5;
          pwVar12 = pwVar12 + 1;
        } while (pwVar8 < pwVar13 + sVar6);
        *ppwVar1 = pwVar12;
      }
      *pwVar12 = L'\0';
      re_refresh(el);
      wVar5 = el_wgetc(el,&local_68);
      if (wVar5 != L'\x01') break;
      bVar2 = (el->el_map).current[(uint)(local_68 & 0xff)];
      if (bVar2 < 0x22) {
        if (bVar2 == 4) {
LAB_0010f49c:
          if ((el->el_search).patlen < 3) {
LAB_0010f5aa:
            terminal_beep(el);
            goto LAB_0010f5b2;
          }
          bVar16 = true;
          eVar4 = '\0';
        }
        else if ((bVar2 == 6) || (bVar2 == 9)) {
          uVar14 = (el->el_search).patlen;
          if (0x3fd < uVar14) goto LAB_0010f5aa;
          (el->el_search).patlen = uVar14 + 1;
          (el->el_search).patbuf[uVar14] = local_68;
          pwVar13 = (el->el_line).lastchar;
          (el->el_line).lastchar = pwVar13 + 1;
          *pwVar13 = local_68;
          pwVar13[1] = L'\0';
LAB_0010f470:
          re_refresh(el);
LAB_0010f5b2:
          eVar4 = '\0';
          bVar16 = false;
        }
        else {
LAB_0010f4b4:
          bVar16 = true;
          if (local_68 == L'\a') {
            eVar4 = '\x06';
          }
          else {
            if (local_68 != L'\x1b') {
              if (local_68 == L'\x17') {
                sVar6 = (el->el_search).patlen;
                if (2 < (long)sVar6) {
                  pwVar13 = (el->el_search).patbuf;
                  pwVar12 = pwVar13 + 2;
                  do {
                    pvVar7 = memchr("*[]?",*pwVar12,5);
                    if (pvVar7 != (void *)0x0) goto LAB_0010f5aa;
                    pwVar12 = pwVar12 + 1;
                  } while (pwVar12 < pwVar13 + sVar6);
                }
                pwVar13 = (el->el_line).cursor;
                if (pwVar13 != (el->el_line).buffer) {
                  pwVar13 = pwVar13 + (sVar6 - 3);
                  (el->el_line).cursor = pwVar13;
                  pwVar12 = c__next_word(pwVar13,(el->el_line).lastchar,L'\x01',ce__isword);
                  pwVar13 = (el->el_line).cursor;
                  while( true ) {
                    if ((pwVar12 <= pwVar13) || (wVar5 = *pwVar13, wVar5 == L'\n'))
                    goto LAB_0010f896;
                    uVar14 = (el->el_search).patlen;
                    if (0x3fd < uVar14) break;
                    (el->el_search).patlen = uVar14 + 1;
                    (el->el_search).patbuf[uVar14] = wVar5;
                    (el->el_line).cursor = pwVar13 + 1;
                    wVar5 = *pwVar13;
                    pwVar8 = (el->el_line).lastchar;
                    (el->el_line).lastchar = pwVar8 + 1;
                    *pwVar8 = wVar5;
                    pwVar13 = pwVar13 + 1;
                  }
                  terminal_beep(el);
LAB_0010f896:
                  (el->el_line).cursor = local_60;
                  *(el->el_line).lastchar = L'\0';
                  goto LAB_0010f470;
                }
                goto LAB_0010f5b2;
              }
              ce_inc_search::endcmd[0] = local_68;
              el_wpush(el,ce_inc_search::endcmd);
            }
            eVar4 = '\x04';
          }
        }
        bVar9 = 0;
      }
      else {
        if (bVar2 == 0x22) goto LAB_0010f49c;
        bVar9 = 1;
        if (bVar2 == 0x25) {
          dir = L'\x17';
        }
        else {
          if (bVar2 != 0x26) goto LAB_0010f4b4;
          dir = L'\x18';
        }
        eVar4 = '\0';
        bVar16 = false;
      }
      pwVar13 = local_50->buffer;
      pwVar12 = *ppwVar1;
      while ((pwVar13 < pwVar12 && (*pwVar12 != L'\n'))) {
        *ppwVar1 = pwVar12 + -1;
        *pwVar12 = L'\0';
        pwVar12 = pwVar12 + -1;
      }
      *pwVar12 = L'\0';
      if (bVar16) {
LAB_0010f7f3:
        if (eVar4 == '\0') {
          bVar17 = false;
          eVar15 = '\0';
        }
        else {
          if (local_48 != 0) {
            return eVar4;
          }
          if (eVar4 != '\x06') {
            return eVar4;
          }
          eVar15 = '\x06';
          bVar17 = true;
        }
      }
      else {
        pwVar8 = (el->el_search).patbuf;
        uVar14 = (el->el_search).patlen;
        local_68 = L']';
        pwVar12 = pwVar8 + uVar14;
        do {
          pwVar12 = pwVar12 + -1;
          if (pwVar12 < pwVar8 + 2) {
            bVar17 = true;
            goto LAB_0010f64f;
          }
          wVar5 = *pwVar12;
        } while ((wVar5 != L']') && (wVar5 != L'['));
        bVar17 = wVar5 != L'[';
        local_68 = wVar5;
LAB_0010f64f:
        if ((2 < uVar14) && (bVar17)) {
          if ((bool)(bVar9 & dir == local_54)) {
            if (ce_inc_search_pchar == 1) {
              (el->el_history).eventno = local_58;
              eVar4 = hist_get(el);
              if (eVar4 == '\x06') {
                hist_get(el);
              }
              pwVar12 = *(wchar_t **)((long)&el->el_prog + local_38);
              (el->el_line).cursor = pwVar12;
              pwVar8 = (el->el_search).patbuf;
              uVar14 = (el->el_search).patlen;
              pwVar13 = (el->el_line).buffer;
            }
            else {
              pwVar12 = (wchar_t *)((long)(el->el_line).cursor + local_40);
              (el->el_line).cursor = pwVar12;
            }
          }
          else {
            pwVar12 = (el->el_line).cursor;
          }
          pwVar8[uVar14] = L'.';
          (el->el_search).patlen = uVar14 + 2;
          pwVar8[uVar14 + 1] = L'*';
          pwVar8[uVar14 + 2] = L'\0';
          if (((pwVar12 < pwVar13) || (*ppwVar1 < pwVar12)) ||
             (eVar4 = ce_search_line(el,dir), eVar4 == '\x06')) {
            (el->el_state).lastcmd = (el_action_t)dir;
            if (dir == L'\x18') {
              eVar4 = ed_search_prev_history(el,0);
              peVar10 = (el_line_t *)ppwVar1;
              wVar5 = L'\x18';
            }
            else {
              eVar4 = ed_search_next_history(el,0);
              peVar10 = local_50;
              wVar5 = dir;
            }
            if (eVar4 == '\x06') {
              sVar6 = (el->el_search).patlen;
              (el->el_search).patlen = sVar6 - 2;
              (el->el_search).patbuf[sVar6 - 2] = L'\0';
              terminal_beep(el);
              if ((el->el_history).eventno != local_64) {
                (el->el_history).eventno = local_64;
                eVar4 = hist_get(el);
                if (eVar4 == '\x06') goto LAB_0010f8c2;
              }
              (el->el_line).cursor = local_60;
              ce_inc_search_pchar = 1;
              goto LAB_0010f7c8;
            }
            (el->el_line).cursor = peVar10->buffer;
            ce_search_line(el,wVar5);
          }
          sVar6 = (el->el_search).patlen;
          (el->el_search).patlen = sVar6 - 2;
          (el->el_search).patbuf[sVar6 - 2] = L'\0';
          ce_inc_search_pchar = 0;
        }
LAB_0010f7c8:
        eVar4 = ce_inc_search(el,dir);
        bVar17 = false;
        eVar15 = '\0';
        if (((eVar4 != '\x06' | bVar3 | ~ce_inc_search_pchar) & 1) != 0) goto LAB_0010f7f3;
      }
      ce_inc_search_pchar = bVar3 & 1;
      (el->el_search).patlen = local_48;
      if ((el->el_history).eventno != local_64) {
        (el->el_history).eventno = local_64;
        eVar4 = hist_get(el);
        if (eVar4 == '\x06') goto LAB_0010f8c2;
      }
      (el->el_line).cursor = local_60;
      if (bVar17) {
        re_refresh(el);
        goto LAB_0010f8c2;
      }
      if (bVar16) {
        return eVar15;
      }
    }
    eVar4 = ed_end_of_file(el,0);
  }
  else {
LAB_0010f8c2:
    eVar4 = '\x06';
  }
  return eVar4;
}

Assistant:

libedit_private el_action_t
ce_inc_search(EditLine *el, int dir)
{
	static const wchar_t STRfwd[] = L"fwd", STRbck[] = L"bck";
	static wchar_t pchar = L':';  /* ':' = normal, '?' = failed */
	static wchar_t endcmd[2] = {'\0', '\0'};
	wchar_t *ocursor = el->el_line.cursor, oldpchar = pchar, ch;
	const wchar_t *cp;

	el_action_t ret = CC_NORM;

	int ohisteventno = el->el_history.eventno;
	size_t oldpatlen = el->el_search.patlen;
	int newdir = dir;
	int done, redo;

	if (el->el_line.lastchar + sizeof(STRfwd) /
	    sizeof(*el->el_line.lastchar) + 2 +
	    el->el_search.patlen >= el->el_line.limit)
		return CC_ERROR;

	for (;;) {

		if (el->el_search.patlen == 0) {	/* first round */
			pchar = ':';
#ifdef ANCHOR
#define	LEN	2
			el->el_search.patbuf[el->el_search.patlen++] = '.';
			el->el_search.patbuf[el->el_search.patlen++] = '*';
#else
#define	LEN	0
#endif
		}
		done = redo = 0;
		*el->el_line.lastchar++ = '\n';
		for (cp = (newdir == ED_SEARCH_PREV_HISTORY) ? STRbck : STRfwd;
		    *cp; *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar++ = pchar;
		for (cp = &el->el_search.patbuf[LEN];
		    cp < &el->el_search.patbuf[el->el_search.patlen];
		    *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar = '\0';
		re_refresh(el);

		if (el_wgetc(el, &ch) != 1)
			return ed_end_of_file(el, 0);

		switch (el->el_map.current[(unsigned char) ch]) {
		case ED_INSERT:
		case ED_DIGIT:
			if (el->el_search.patlen >= EL_BUFSIZ - LEN)
				terminal_beep(el);
			else {
				el->el_search.patbuf[el->el_search.patlen++] =
				    ch;
				*el->el_line.lastchar++ = ch;
				*el->el_line.lastchar = '\0';
				re_refresh(el);
			}
			break;

		case EM_INC_SEARCH_NEXT:
			newdir = ED_SEARCH_NEXT_HISTORY;
			redo++;
			break;

		case EM_INC_SEARCH_PREV:
			newdir = ED_SEARCH_PREV_HISTORY;
			redo++;
			break;

		case EM_DELETE_PREV_CHAR:
		case ED_DELETE_PREV_CHAR:
			if (el->el_search.patlen > LEN)
				done++;
			else
				terminal_beep(el);
			break;

		default:
			switch (ch) {
			case 0007:	/* ^G: Abort */
				ret = CC_ERROR;
				done++;
				break;

			case 0027:	/* ^W: Append word */
			/* No can do if globbing characters in pattern */
				for (cp = &el->el_search.patbuf[LEN];; cp++)
				    if (cp >= &el->el_search.patbuf[
					el->el_search.patlen]) {
					if (el->el_line.cursor ==
					    el->el_line.buffer)
						break;
					el->el_line.cursor +=
					    el->el_search.patlen - LEN - 1;
					cp = c__next_word(el->el_line.cursor,
					    el->el_line.lastchar, 1,
					    ce__isword);
					while (el->el_line.cursor < cp &&
					    *el->el_line.cursor != '\n') {
						if (el->el_search.patlen >=
						    EL_BUFSIZ - LEN) {
							terminal_beep(el);
							break;
						}
						el->el_search.patbuf[el->el_search.patlen++] =
						    *el->el_line.cursor;
						*el->el_line.lastchar++ =
						    *el->el_line.cursor++;
					}
					el->el_line.cursor = ocursor;
					*el->el_line.lastchar = '\0';
					re_refresh(el);
					break;
				    } else if (isglob(*cp)) {
					    terminal_beep(el);
					    break;
				    }
				break;

			default:	/* Terminate and execute cmd */
				endcmd[0] = ch;
				el_wpush(el, endcmd);
				/* FALLTHROUGH */

			case 0033:	/* ESC: Terminate */
				ret = CC_REFRESH;
				done++;
				break;
			}
			break;
		}

		while (el->el_line.lastchar > el->el_line.buffer &&
		    *el->el_line.lastchar != '\n')
			*el->el_line.lastchar-- = '\0';
		*el->el_line.lastchar = '\0';

		if (!done) {

			/* Can't search if unmatched '[' */
			for (cp = &el->el_search.patbuf[el->el_search.patlen-1],
			    ch = L']';
			    cp >= &el->el_search.patbuf[LEN];
			    cp--)
				if (*cp == '[' || *cp == ']') {
					ch = *cp;
					break;
				}
			if (el->el_search.patlen > LEN && ch != L'[') {
				if (redo && newdir == dir) {
					if (pchar == '?') { /* wrap around */
						el->el_history.eventno =
						    newdir == ED_SEARCH_PREV_HISTORY ? 0 : 0x7fffffff;
						if (hist_get(el) == CC_ERROR)
							/* el->el_history.event
							 * no was fixed by
							 * first call */
							(void) hist_get(el);
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
					} else
						el->el_line.cursor +=
						    newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    -1 : 1;
				}
#ifdef ANCHOR
				el->el_search.patbuf[el->el_search.patlen++] =
				    '.';
				el->el_search.patbuf[el->el_search.patlen++] =
				    '*';
#endif
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (el->el_line.cursor < el->el_line.buffer ||
				    el->el_line.cursor > el->el_line.lastchar ||
				    (ret = ce_search_line(el, newdir))
				    == CC_ERROR) {
					/* avoid c_setpat */
					el->el_state.lastcmd =
					    (el_action_t) newdir;
					ret = (el_action_t)
					    (newdir == ED_SEARCH_PREV_HISTORY ?
					    ed_search_prev_history(el, 0) :
					    ed_search_next_history(el, 0));
					if (ret != CC_ERROR) {
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
						(void) ce_search_line(el,
						    newdir);
					}
				}
				el->el_search.patlen -= LEN;
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (ret == CC_ERROR) {
					terminal_beep(el);
					if (el->el_history.eventno !=
					    ohisteventno) {
						el->el_history.eventno =
						    ohisteventno;
						if (hist_get(el) == CC_ERROR)
							return CC_ERROR;
					}
					el->el_line.cursor = ocursor;
					pchar = '?';
				} else {
					pchar = ':';
				}
			}
			ret = ce_inc_search(el, newdir);

			if (ret == CC_ERROR && pchar == '?' && oldpchar == ':')
				/*
				 * break abort of failed search at last
				 * non-failed
				 */
				ret = CC_NORM;

		}
		if (ret == CC_NORM || (ret == CC_ERROR && oldpatlen == 0)) {
			/* restore on normal return or error exit */
			pchar = oldpchar;
			el->el_search.patlen = oldpatlen;
			if (el->el_history.eventno != ohisteventno) {
				el->el_history.eventno = ohisteventno;
				if (hist_get(el) == CC_ERROR)
					return CC_ERROR;
			}
			el->el_line.cursor = ocursor;
			if (ret == CC_ERROR)
				re_refresh(el);
		}
		if (done || ret != CC_NORM)
			return ret;
	}
}